

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcdata_op.cc
# Opt level: O2

PcodeOp * cseFindInBlock(PcodeOp *op,Varnode *vn,BlockBasic *bl,PcodeOp *earliest)

{
  PcodeOp *pPVar1;
  int4 iVar2;
  _List_node_base *p_Var3;
  Varnode *buf2 [2];
  Varnode *buf1 [2];
  Varnode *apVStack_58 [2];
  Varnode *local_48 [3];
  
  p_Var3 = (_List_node_base *)&vn->descend;
  do {
    p_Var3 = (((_List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_> *)&p_Var3->_M_next)->_M_impl).
             _M_node.super__List_node_base._M_next;
    if (p_Var3 == (_List_node_base *)&vn->descend) {
      return (PcodeOp *)0x0;
    }
    pPVar1 = (PcodeOp *)p_Var3[1]._M_next;
  } while ((((pPVar1 == op) || (pPVar1->parent != bl)) ||
           ((earliest != (PcodeOp *)0x0 && ((earliest->start).order < (pPVar1->start).order)))) ||
          ((pPVar1->output == (Varnode *)0x0 ||
           (iVar2 = functionalEqualityLevel(op->output,pPVar1->output,local_48,apVStack_58),
           iVar2 != 0))));
  return pPVar1;
}

Assistant:

PcodeOp *cseFindInBlock(PcodeOp *op,Varnode *vn,BlockBasic *bl,PcodeOp *earliest)

{
  list<PcodeOp *>::const_iterator iter;
  
  for(iter=vn->beginDescend();iter!=vn->endDescend();++iter) {
    PcodeOp *res = *iter;
    if (res == op) continue;	// Must not be -op-
    if (res->getParent() != bl) continue; // Must be in -bl-
    if (earliest != (PcodeOp *)0) {
      if (earliest->getSeqNum().getOrder() < res->getSeqNum().getOrder()) continue; // Must occur earlier than earliest
    }
    Varnode *outvn1 = op->getOut();
    Varnode *outvn2 = res->getOut();
    if (outvn2 == (Varnode *)0) continue;
    Varnode *buf1[2];
    Varnode *buf2[2];
    if (functionalEqualityLevel(outvn1,outvn2,buf1,buf2) == 0)
      return res;
  }
  return (PcodeOp *)0;
}